

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O0

bool WScriptJsrt::PrintException(LPCSTR fileName,JsErrorCode jsErrorCode,JsValueRef exception)

{
  bool bVar1;
  JsErrorCode JVar2;
  PAL_FILE *pPVar3;
  LPWSTR pWVar4;
  undefined4 uVar5;
  LPCSTR local_7e8;
  char local_748 [8];
  CHAR ext_2 [256];
  CHAR shortFileName_2 [260];
  char *fName;
  undefined1 local_530 [4];
  JsErrorCode errorCode;
  AutoString errorStack;
  JsValueRef stackProperty;
  JsPropertyIdRef stackPropertyId;
  char local_4f8 [4];
  JsValueType propertyType;
  CHAR ext_1 [256];
  CHAR shortFileName_1 [260];
  int local_2e8;
  int local_2e4;
  int column_1;
  int line_1;
  JsValueRef columnProperty_1;
  JsPropertyIdRef columnPropertyId_1;
  JsValueRef lineProperty_1;
  JsPropertyIdRef linePropertyId_1;
  int column;
  int line;
  JsValueRef columnProperty;
  JsPropertyIdRef columnPropertyId;
  JsValueRef lineProperty;
  JsPropertyIdRef linePropertyId;
  CHAR ext [256];
  CHAR shortFileName [260];
  JsValueRef message;
  JsPropertyIdRef local_80;
  JsPropertyIdRef messagePropertyId;
  JsValueRef throwAway;
  bool hasException;
  undefined1 local_60 [8];
  AutoString errorMessage;
  JsPropertyIdRef exceptionId;
  JsValueRef metaData;
  LPCWSTR errorTypeString;
  JsValueRef exception_local;
  LPCSTR pCStack_18;
  JsErrorCode jsErrorCode_local;
  LPCSTR fileName_local;
  
  errorTypeString = (LPCWSTR)exception;
  exception_local._4_4_ = jsErrorCode;
  pCStack_18 = fileName;
  metaData = ConvertErrorCodeToMessage(jsErrorCode);
  exceptionId = (JsPropertyIdRef)0x0;
  if (errorTypeString == (LPCWSTR)0x0) {
    JVar2 = ChakraRTInterface::JsGetAndClearExceptionWithMetadata(&exceptionId);
    if (JVar2 == JsNoError) {
      errorMessage.errorCode = JsNoError;
      errorMessage.dontFree = false;
      errorMessage._29_3_ = 0;
      JVar2 = CreatePropertyIdFromString("exception",(JsPropertyIdRef *)&errorMessage.errorCode);
      if (JVar2 != JsNoError) {
        fileName_local._7_1_ = 0;
        goto LAB_0011a9a5;
      }
      JVar2 = ChakraRTInterface::JsGetProperty
                        (exceptionId,(JsPropertyIdRef)errorMessage._24_8_,&errorTypeString);
      if (JVar2 != JsNoError) {
        fileName_local._7_1_ = 0;
        goto LAB_0011a9a5;
      }
    }
    else {
      JVar2 = ChakraRTInterface::JsGetAndClearException(&errorTypeString);
      if (JVar2 != JsNoError) {
        fileName_local._7_1_ = 0;
        goto LAB_0011a9a5;
      }
    }
  }
  if ((HostConfigFlags::flags.MuteHostErrorMsgIsEnabled & 1U) != 0) {
    fileName_local._7_1_ = 0;
    goto LAB_0011a9a5;
  }
  if (errorTypeString == (LPCWSTR)0x0) {
    pPVar3 = PAL_get_stderr(0);
    PAL_fwprintf(pPVar3,L"Error : %ls\n",metaData);
    fileName_local._7_1_ = 0;
    goto LAB_0011a9a5;
  }
  if ((exception_local._4_4_ == JsErrorScriptCompile) ||
     (exception_local._4_4_ == JsErrorScriptException)) {
    AutoString::AutoString((AutoString *)local_60);
    JVar2 = AutoString::Initialize((AutoString *)local_60,errorTypeString);
    if (JVar2 != JsNoError) {
      pPVar3 = PAL_get_stderr(0);
      PAL_fwprintf(pPVar3,L"ERROR attempting to coerce error to string, using alternate handler\n");
      throwAway._3_1_ = 0;
      ChakraRTInterface::JsHasException((bool *)((long)&throwAway + 3));
      if ((throwAway._3_1_ & 1) != 0) {
        messagePropertyId = (JsPropertyIdRef)0x0;
        ChakraRTInterface::JsGetAndClearException(&messagePropertyId);
      }
      local_80 = (JsPropertyIdRef)0x0;
      JVar2 = CreatePropertyIdFromString("message",&local_80);
      if (JVar2 == JsNoError) {
        stack0xffffffffffffff70 = (JsValueRef)0x0;
        JVar2 = ChakraRTInterface::JsGetProperty
                          (errorTypeString,local_80,(JsValueRef *)(shortFileName + 0x100));
        if (JVar2 == JsNoError) {
          JVar2 = AutoString::Initialize((AutoString *)local_60,stack0xffffffffffffff70);
          if (JVar2 == JsNoError) {
            if (exception_local._4_4_ == JsErrorScriptCompile) goto LAB_0011a469;
            uVar5 = 0;
            _splitpath_s(pCStack_18,(char *)0x0,0,(char *)0x0,0,ext + 0xf8,0x104,
                         (char *)&linePropertyId,0x100);
            if (exceptionId == (JsPropertyIdRef)0x0) {
              pPVar3 = PAL_get_stderr(0);
              pWVar4 = AutoString::GetWideString((AutoString *)local_60,(charcount_t *)0x0);
              PAL_fwprintf(pPVar3,L"%ls\n\tat code (%S%S:??:??)\n",pWVar4,ext + 0xf8,&linePropertyId
                          );
LAB_0011a457:
              fileName_local._7_1_ = 1;
              bVar1 = true;
            }
            else {
              lineProperty = (JsValueRef)0x0;
              columnPropertyId = (JsPropertyIdRef)0x0;
              columnProperty = (JsValueRef)0x0;
              _column = (JsValueRef)0x0;
              JVar2 = CreatePropertyIdFromString("line",&lineProperty);
              if (JVar2 == JsNoError) {
                JVar2 = ChakraRTInterface::JsGetProperty(exceptionId,lineProperty,&columnPropertyId)
                ;
                if (JVar2 == JsNoError) {
                  JVar2 = ChakraRTInterface::JsNumberToInt
                                    (columnPropertyId,(int *)((long)&linePropertyId_1 + 4));
                  if (JVar2 == JsNoError) {
                    JVar2 = CreatePropertyIdFromString("column",&columnProperty);
                    if (JVar2 == JsNoError) {
                      JVar2 = ChakraRTInterface::JsGetProperty
                                        (exceptionId,columnProperty,(JsValueRef *)&column);
                      if (JVar2 == JsNoError) {
                        JVar2 = ChakraRTInterface::JsNumberToInt(_column,(int *)&linePropertyId_1);
                        if (JVar2 == JsNoError) {
                          pPVar3 = PAL_get_stderr(0);
                          pWVar4 = AutoString::GetWideString
                                             ((AutoString *)local_60,(charcount_t *)0x0);
                          PAL_fwprintf(pPVar3,L"%ls\n        at code (%S%S:%d:%d)\n",pWVar4,
                                       ext + 0xf8,&linePropertyId,
                                       (ulong)(linePropertyId_1._4_4_ + 1),
                                       CONCAT44(uVar5,(int)linePropertyId_1 + 1));
                          goto LAB_0011a457;
                        }
                        fileName_local._7_1_ = 0;
                        bVar1 = true;
                      }
                      else {
                        fileName_local._7_1_ = 0;
                        bVar1 = true;
                      }
                    }
                    else {
                      fileName_local._7_1_ = 0;
                      bVar1 = true;
                    }
                  }
                  else {
                    fileName_local._7_1_ = 0;
                    bVar1 = true;
                  }
                }
                else {
                  fileName_local._7_1_ = 0;
                  bVar1 = true;
                }
              }
              else {
                fileName_local._7_1_ = 0;
                bVar1 = true;
              }
            }
          }
          else {
            fileName_local._7_1_ = 0;
            bVar1 = true;
          }
        }
        else {
          fileName_local._7_1_ = 0;
          bVar1 = true;
        }
      }
      else {
        fileName_local._7_1_ = 0;
        bVar1 = true;
      }
      goto LAB_0011a942;
    }
LAB_0011a469:
    if (exception_local._4_4_ == JsErrorScriptCompile) {
      lineProperty_1 = (JsValueRef)0x0;
      columnPropertyId_1 = (JsPropertyIdRef)0x0;
      columnProperty_1 = (JsValueRef)0x0;
      _column_1 = (JsValueRef)0x0;
      JVar2 = CreatePropertyIdFromString("line",&lineProperty_1);
      if (JVar2 == JsNoError) {
        JVar2 = ChakraRTInterface::JsGetProperty(errorTypeString,lineProperty_1,&columnPropertyId_1)
        ;
        if (JVar2 == JsNoError) {
          JVar2 = ChakraRTInterface::JsNumberToInt(columnPropertyId_1,&local_2e4);
          if (JVar2 != JsNoError) {
            fileName_local._7_1_ = 0;
            bVar1 = true;
            goto LAB_0011a942;
          }
          JVar2 = CreatePropertyIdFromString("column",&columnProperty_1);
          if (JVar2 != JsNoError) {
            fileName_local._7_1_ = 0;
            bVar1 = true;
            goto LAB_0011a942;
          }
          JVar2 = ChakraRTInterface::JsGetProperty
                            (errorTypeString,columnProperty_1,(JsValueRef *)&column_1);
          if (JVar2 != JsNoError) {
            fileName_local._7_1_ = 0;
            bVar1 = true;
            goto LAB_0011a942;
          }
          JVar2 = ChakraRTInterface::JsNumberToInt(_column_1,&local_2e8);
          if (JVar2 != JsNoError) {
            fileName_local._7_1_ = 0;
            bVar1 = true;
            goto LAB_0011a942;
          }
          uVar5 = 0;
          _splitpath_s(pCStack_18,(char *)0x0,0,(char *)0x0,0,ext_1 + 0xf8,0x104,local_4f8,0x100);
          pPVar3 = PAL_get_stderr(0);
          pWVar4 = AutoString::GetWideString((AutoString *)local_60,(charcount_t *)0x0);
          PAL_fwprintf(pPVar3,L"%ls\n\tat code (%S%S:%d:%d)\n",pWVar4,ext_1 + 0xf8,local_4f8,
                       (ulong)(local_2e4 + 1),CONCAT44(uVar5,local_2e8 + 1));
          goto LAB_0011a93b;
        }
        fileName_local._7_1_ = 0;
        bVar1 = true;
      }
      else {
        fileName_local._7_1_ = 0;
        bVar1 = true;
      }
    }
    else {
      stackPropertyId._4_4_ = 0;
      stackProperty = (JsValueRef)0x0;
      errorStack.errorCode = JsNoError;
      errorStack.dontFree = false;
      errorStack._29_3_ = 0;
      AutoString::AutoString((AutoString *)local_530);
      fName._4_4_ = CreatePropertyIdFromString("stack",&stackProperty);
      if ((fName._4_4_ == JsNoError) &&
         (fName._4_4_ = ChakraRTInterface::JsGetProperty
                                  (errorTypeString,stackProperty,(JsValueRef *)&errorStack.errorCode
                                  ), fName._4_4_ == JsNoError)) {
        fName._4_4_ = ChakraRTInterface::JsGetValueType
                                ((JsValueRef)errorStack._24_8_,
                                 (JsValueType *)((long)&stackPropertyId + 4));
      }
      if ((fName._4_4_ == JsNoError) && (stackPropertyId._4_4_ != 0)) {
        JVar2 = AutoString::Initialize((AutoString *)local_530,(JsValueRef)errorStack._24_8_);
        if (JVar2 == JsNoError) {
          pPVar3 = PAL_get_stderr(0);
          pWVar4 = AutoString::GetWideString((AutoString *)local_530,(charcount_t *)0x0);
          PAL_fwprintf(pPVar3,L"%ls\n",pWVar4);
          goto LAB_0011a91d;
        }
        fileName_local._7_1_ = 0;
        bVar1 = true;
      }
      else {
        if (pCStack_18 == (LPCSTR)0x0) {
          local_7e8 = "(unknown)";
        }
        else {
          local_7e8 = pCStack_18;
        }
        _splitpath_s(local_7e8,(char *)0x0,0,(char *)0x0,0,ext_2 + 0xf8,0x104,local_748,0x100);
        pPVar3 = PAL_get_stderr(0);
        PAL_fprintf(pPVar3,"thrown at %s%s:\n^\n",ext_2 + 0xf8,local_748);
        pPVar3 = PAL_get_stderr(0);
        pWVar4 = AutoString::GetWideString((AutoString *)local_60,(charcount_t *)0x0);
        PAL_fwprintf(pPVar3,L"%ls\n",pWVar4);
LAB_0011a91d:
        bVar1 = false;
      }
      AutoString::~AutoString((AutoString *)local_530);
      if (!bVar1) {
LAB_0011a93b:
        bVar1 = false;
      }
    }
LAB_0011a942:
    AutoString::~AutoString((AutoString *)local_60);
    if (bVar1) goto LAB_0011a9a5;
  }
  else {
    pPVar3 = PAL_get_stderr(0);
    PAL_fwprintf(pPVar3,L"Error : %ls\n",metaData);
  }
  fileName_local._7_1_ = 1;
LAB_0011a9a5:
  return (bool)(fileName_local._7_1_ & 1);
}

Assistant:

bool WScriptJsrt::PrintException(LPCSTR fileName, JsErrorCode jsErrorCode, JsValueRef exception)
{
    LPCWSTR errorTypeString = ConvertErrorCodeToMessage(jsErrorCode);
    JsValueRef metaData = JS_INVALID_REFERENCE;

    if (exception == nullptr)
    {
        if (ChakraRTInterface::JsGetAndClearExceptionWithMetadata(&metaData) == JsNoError)
        {
            JsPropertyIdRef exceptionId = JS_INVALID_REFERENCE;
            IfJsrtErrorFail(CreatePropertyIdFromString("exception", &exceptionId), false);
            IfJsrtErrorFail(ChakraRTInterface::JsGetProperty(metaData, exceptionId, &exception), false);
        }
        else
        {
            IfJsrtErrorFail(ChakraRTInterface::JsGetAndClearException(&exception), false);
        }

    }

    if (HostConfigFlags::flags.MuteHostErrorMsgIsEnabled)
    {
        return false;
    }

    if (exception != nullptr)
    {
        if (jsErrorCode == JsErrorCode::JsErrorScriptCompile || jsErrorCode == JsErrorCode::JsErrorScriptException)
        {
            AutoString errorMessage;

            if (errorMessage.Initialize(exception) != JsNoError)
            {
                fwprintf(stderr, _u("ERROR attempting to coerce error to string, using alternate handler\n"));
                bool hasException = false;
                ChakraRTInterface::JsHasException(&hasException);
                if (hasException)
                {
                    JsValueRef throwAway = JS_INVALID_REFERENCE;
                    ChakraRTInterface::JsGetAndClearException(&throwAway);
                }
                JsPropertyIdRef messagePropertyId = JS_INVALID_REFERENCE;
                IfJsrtErrorFail(CreatePropertyIdFromString("message", &messagePropertyId), false);
                JsValueRef message = JS_INVALID_REFERENCE;
                IfJsrtErrorFail(ChakraRTInterface::JsGetProperty(exception, messagePropertyId, &message), false);
                IfJsrtErrorFail(errorMessage.Initialize(message), false);

                if (jsErrorCode != JsErrorCode::JsErrorScriptCompile)
                {
                    CHAR shortFileName[_MAX_PATH];
                    CHAR ext[_MAX_EXT];
                    _splitpath_s(fileName, nullptr, 0, nullptr, 0, shortFileName, _countof(shortFileName), ext, _countof(ext));

                    if (metaData != JS_INVALID_REFERENCE)
                    {
                        JsPropertyIdRef linePropertyId = JS_INVALID_REFERENCE;
                        JsValueRef lineProperty = JS_INVALID_REFERENCE;

                        JsPropertyIdRef columnPropertyId = JS_INVALID_REFERENCE;
                        JsValueRef columnProperty = JS_INVALID_REFERENCE;
                        
                        int line;
                        int column;
                        
                        IfJsrtErrorFail(CreatePropertyIdFromString("line", &linePropertyId), false);
                        IfJsrtErrorFail(ChakraRTInterface::JsGetProperty(metaData, linePropertyId, &lineProperty), false);
                        IfJsrtErrorFail(ChakraRTInterface::JsNumberToInt(lineProperty, &line), false);

                        IfJsrtErrorFail(CreatePropertyIdFromString("column", &columnPropertyId), false);
                        IfJsrtErrorFail(ChakraRTInterface::JsGetProperty(metaData, columnPropertyId, &columnProperty), false);
                        IfJsrtErrorFail(ChakraRTInterface::JsNumberToInt(columnProperty, &column), false);
                        fwprintf(stderr, _u("%ls\n        at code (%S%S:%d:%d)\n"),
                            errorMessage.GetWideString(), shortFileName, ext, line + 1, column + 1);
                    }
                    else
                    {
                        fwprintf(stderr, _u("%ls\n\tat code (%S%S:\?\?:\?\?)\n"), errorMessage.GetWideString(), shortFileName, ext);
                    }
                    return true;
                }
            }

            if (jsErrorCode == JsErrorCode::JsErrorScriptCompile)
            {
                JsPropertyIdRef linePropertyId = JS_INVALID_REFERENCE;
                JsValueRef lineProperty = JS_INVALID_REFERENCE;

                JsPropertyIdRef columnPropertyId = JS_INVALID_REFERENCE;
                JsValueRef columnProperty = JS_INVALID_REFERENCE;

                int line;
                int column;
                
                IfJsrtErrorFail(CreatePropertyIdFromString("line", &linePropertyId), false);
                IfJsrtErrorFail(ChakraRTInterface::JsGetProperty(exception, linePropertyId, &lineProperty), false);
                IfJsrtErrorFail(ChakraRTInterface::JsNumberToInt(lineProperty, &line), false);

                IfJsrtErrorFail(CreatePropertyIdFromString("column", &columnPropertyId), false);
                IfJsrtErrorFail(ChakraRTInterface::JsGetProperty(exception, columnPropertyId, &columnProperty), false);
                IfJsrtErrorFail(ChakraRTInterface::JsNumberToInt(columnProperty, &column), false);

                CHAR shortFileName[_MAX_PATH];
                CHAR ext[_MAX_EXT];
                _splitpath_s(fileName, nullptr, 0, nullptr, 0, shortFileName, _countof(shortFileName), ext, _countof(ext));
                fwprintf(stderr, _u("%ls\n\tat code (%S%S:%d:%d)\n"),
                    errorMessage.GetWideString(), shortFileName, ext, (int)line + 1,
                    (int)column + 1);
            }
            else
            {
                JsValueType propertyType = JsUndefined;
                JsPropertyIdRef stackPropertyId = JS_INVALID_REFERENCE;
                JsValueRef stackProperty = JS_INVALID_REFERENCE;
                AutoString errorStack;

                JsErrorCode errorCode = CreatePropertyIdFromString("stack", &stackPropertyId);

                if (errorCode == JsErrorCode::JsNoError)
                {
                    errorCode = ChakraRTInterface::JsGetProperty(exception, stackPropertyId, &stackProperty);
                    if (errorCode == JsErrorCode::JsNoError)
                    {
                        errorCode = ChakraRTInterface::JsGetValueType(stackProperty, &propertyType);
                    }
                }

                if (errorCode != JsErrorCode::JsNoError || propertyType == JsUndefined)
                {
                    const char *fName = fileName != nullptr ? fileName : "(unknown)";

                    CHAR shortFileName[_MAX_PATH];
                    CHAR ext[_MAX_EXT];
                    _splitpath_s(fName, nullptr, 0, nullptr, 0, shortFileName, _countof(shortFileName), ext, _countof(ext));

                    // do not mix char/wchar. print them separately
                    fprintf(stderr, "thrown at %s%s:\n^\n", shortFileName, ext);
                    fwprintf(stderr, _u("%ls\n"), errorMessage.GetWideString());
                }
                else
                {
                    IfJsrtErrorFail(errorStack.Initialize(stackProperty), false);
                    fwprintf(stderr, _u("%ls\n"), errorStack.GetWideString());
                }
            }
        }
        else
        {
            fwprintf(stderr, _u("Error : %ls\n"), errorTypeString);
        }
        return true;
    }
    else
    {
        fwprintf(stderr, _u("Error : %ls\n"), errorTypeString);
    }
    return false;
}